

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<kj::ArrayPtr<int>_>_>::flattenTo
          (Delimited<kj::ArrayPtr<kj::ArrayPtr<int>_>_> *this,char *target)

{
  size_t sVar1;
  char *__src;
  bool bVar2;
  long lVar3;
  Delimited<kj::ArrayPtr<int>_> *elem;
  Delimited<kj::ArrayPtr<int>_> *this_00;
  
  ensureStringifiedInitialized(this);
  sVar1 = (this->stringified).size_;
  if (sVar1 != 0) {
    this_00 = (this->stringified).ptr;
    lVar3 = sVar1 * 0x38;
    bVar2 = true;
    do {
      if (!bVar2) {
        __src = (this->delimiter).content.ptr;
        sVar1 = (this->delimiter).content.size_;
        if (__src != __src + (sVar1 - 1)) {
          memcpy(target,__src,sVar1 - 1);
          target = target + (sVar1 - 1);
        }
      }
      target = Delimited<kj::ArrayPtr<int>_>::flattenTo(this_00,target);
      this_00 = this_00 + 1;
      bVar2 = false;
      lVar3 = lVar3 + -0x38;
    } while (lVar3 != 0);
  }
  return target;
}

Assistant:

char* flattenTo(char* __restrict__ target) {
    ensureStringifiedInitialized();

    bool first = true;
    for (auto& elem: stringified) {
      if (first) {
        first = false;
      } else {
        target = fill(target, delimiter);
      }
      target = fill(target, elem);
    }
    return target;
  }